

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_master_table.c
# Opt level: O0

ion_err_t ion_find_by_use_master_table
                    (ion_dictionary_config_info_t *config,ion_dict_use_t use_type,char whence)

{
  ion_err_t iVar1;
  undefined1 auStack_40 [7];
  ion_err_t error;
  ion_dictionary_config_info_t tconfig;
  ion_dictionary_id_t id;
  char whence_local;
  ion_dict_use_t use_type_local;
  ion_dictionary_config_info_t *config_local;
  
  auStack_40._0_4_ = 0;
  tconfig.dictionary_type = dictionary_type_flat_file_t;
  tconfig._30_1_ = whence;
  tconfig._31_1_ = use_type;
  if (whence == -1) {
    tconfig.dictionary_type = ion_master_table_next_id - dictionary_type_flat_file_t;
  }
  do {
    if (ion_master_table_next_id <= tconfig.dictionary_type ||
        tconfig.dictionary_type == dictionary_type_bpp_tree_t) {
      return '\x01';
    }
    iVar1 = ion_lookup_in_master_table
                      (tconfig.dictionary_type,(ion_dictionary_config_info_t *)auStack_40);
    if (iVar1 != '\x01') {
      if (iVar1 != '\0') {
        return iVar1;
      }
      if ((stack0xffffffffffffffc4 & 0xff) == (uint)(byte)tconfig._31_1_) {
        config->id = auStack_40._0_4_;
        config->use_type = (char)stack0xffffffffffffffc4;
        *(int3 *)&config->field_0x5 = (int3)(stack0xffffffffffffffc4 >> 8);
        *(undefined8 *)&config->type = tconfig._0_8_;
        config->value_size = tconfig.type;
        config->dictionary_size = tconfig.key_size;
        *(undefined8 *)&config->dictionary_type = tconfig._16_8_;
        return '\0';
      }
    }
    tconfig.dictionary_type = (int)(char)tconfig._30_1_ + tconfig.dictionary_type;
  } while( true );
}

Assistant:

ion_err_t
ion_find_by_use_master_table(
	ion_dictionary_config_info_t	*config,
	ion_dict_use_t					use_type,
	char							whence
) {
	ion_dictionary_id_t				id;
	ion_dictionary_config_info_t	tconfig;
	ion_err_t						error;

	tconfig.id	= 0;

	id			= 1;

	if (ION_MASTER_TABLE_FIND_LAST == whence) {
		id = ion_master_table_next_id - 1;
	}

	/* Loop through all items. */
	for (; id < ion_master_table_next_id && id > 0; id += whence) {
		error = ion_lookup_in_master_table(id, &tconfig);

		if (err_item_not_found == error) {
			continue;
		}

		if (err_ok != error) {
			return error;
		}

		/* If this config has the right type, set the output pointer. */
		if (tconfig.use_type == use_type) {
			*config = tconfig;

			return err_ok;
		}
	}

	return err_item_not_found;
}